

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derDec3(octet **val,octet *der,size_t count,u32 tag,size_t len)

{
  int in_ECX;
  octet **in_RDX;
  u32 *in_RSI;
  octet *in_R8;
  size_t l;
  u32 t;
  undefined8 local_40;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  local_8 = derDec(in_RSI,in_RDX,(size_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (((local_8 == 0xffffffffffffffff) || (in_stack_ffffffffffffffcc != in_ECX)) ||
     (local_40 != in_R8)) {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t derDec3(const octet** val, const octet der[], size_t count,
	u32 tag, size_t len)
{
	u32 t;
	size_t l;
	count = derDec(&t, val, &l, der, count);
	if (count == SIZE_MAX || t != tag || l != len)
		return SIZE_MAX;
	return count;
}